

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystem.h
# Opt level: O0

void __thiscall
llvm::sys::fs::directory_iterator::update_error_code_for_current_entry
          (directory_iterator *this,error_code *ec)

{
  bool bVar1;
  element_type *peVar2;
  error_code eVar3;
  undefined4 uStack_b4;
  undefined1 local_a8 [8];
  ErrorOr<llvm::sys::fs::basic_file_status> status;
  error_code *ec_local;
  directory_iterator *this_local;
  
  bVar1 = std::error_code::operator_cast_to_bool(ec);
  if (!bVar1) {
    peVar2 = std::
             __shared_ptr_access<llvm::sys::fs::detail::DirIterState,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<llvm::sys::fs::detail::DirIterState,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    memset(&status.field_0x30,0,0x58);
    directory_entry::directory_entry((directory_entry *)&status.field_0x30);
    bVar1 = directory_entry::operator==(&peVar2->CurrentEntry,(directory_entry *)&status.field_0x30)
    ;
    directory_entry::~directory_entry((directory_entry *)&status.field_0x30);
    if (!bVar1) {
      peVar2 = std::
               __shared_ptr_access<llvm::sys::fs::detail::DirIterState,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<llvm::sys::fs::detail::DirIterState,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      directory_entry::status
                ((ErrorOr<llvm::sys::fs::basic_file_status> *)local_a8,&peVar2->CurrentEntry);
      bVar1 = ErrorOr::operator_cast_to_bool((ErrorOr *)local_a8);
      if (!bVar1) {
        eVar3 = ErrorOr<llvm::sys::fs::basic_file_status>::getError
                          ((ErrorOr<llvm::sys::fs::basic_file_status> *)local_a8);
        *(ulong *)ec = CONCAT44(uStack_b4,eVar3._M_value);
        ec->_M_cat = eVar3._M_cat;
      }
      ErrorOr<llvm::sys::fs::basic_file_status>::~ErrorOr
                ((ErrorOr<llvm::sys::fs::basic_file_status> *)local_a8);
    }
  }
  return;
}

Assistant:

void update_error_code_for_current_entry(std::error_code &ec) {
    // Bail out if error has already occured earlier to avoid overwriting it.
    if (ec)
      return;

    // Empty directory entry is used to mark the end of an interation, it's not
    // an error.
    if (State->CurrentEntry == directory_entry())
      return;

    ErrorOr<basic_file_status> status = State->CurrentEntry.status();
    if (!status)
      ec = status.getError();
  }